

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void t1_builder_close_contour(T1_Builder builder)

{
  int iVar1;
  short sVar2;
  FT_Outline *pFVar3;
  FT_Vector *pFVar4;
  int iVar5;
  long lVar6;
  
  pFVar3 = builder->current;
  if (pFVar3 != (FT_Outline *)0x0) {
    sVar2 = pFVar3->n_contours;
    iVar5 = 0;
    if (1 < sVar2) {
      iVar5 = pFVar3->contours[(int)sVar2 - 2] + 1;
    }
    if ((sVar2 == 0) || (iVar5 != pFVar3->n_points)) {
      lVar6 = (long)pFVar3->n_points;
      if (1 < lVar6) {
        pFVar4 = pFVar3->points;
        if (((pFVar4[iVar5].x == pFVar4[lVar6 + -1].x) && (pFVar4[iVar5].y == pFVar4[lVar6 + -1].y))
           && (pFVar3->tags[lVar6 + -1] == '\x01')) {
          pFVar3->n_points = pFVar3->n_points + -1;
        }
      }
      if (0 < sVar2) {
        iVar1 = pFVar3->n_points + -1;
        if (iVar5 == iVar1) {
          pFVar3->n_contours = sVar2 + -1;
          pFVar3->n_points = pFVar3->n_points + -1;
        }
        else {
          pFVar3->contours[(int)sVar2 - 1] = (short)iVar1;
        }
      }
    }
    else {
      pFVar3->n_contours = sVar2 + -1;
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_builder_close_contour( T1_Builder  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Int       first;


    if ( !outline )
      return;

    first = outline->n_contours <= 1
            ? 0 : outline->contours[outline->n_contours - 2] + 1;

    /* in malformed fonts it can happen that a contour was started */
    /* but no points were added                                    */
    if ( outline->n_contours && first == outline->n_points )
    {
      outline->n_contours--;
      return;
    }

    /* We must not include the last point in the path if it */
    /* is located on the first point.                       */
    if ( outline->n_points > 1 )
    {
      FT_Vector*  p1      = outline->points + first;
      FT_Vector*  p2      = outline->points + outline->n_points - 1;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points - 1;


      /* `delete' last point only if it coincides with the first */
      /* point and it is not a control point (which can happen). */
      if ( p1->x == p2->x && p1->y == p2->y )
        if ( *control == FT_CURVE_TAG_ON )
          outline->n_points--;
    }

    if ( outline->n_contours > 0 )
    {
      /* Don't add contours only consisting of one point, i.e.,  */
      /* check whether the first and the last point is the same. */
      if ( first == outline->n_points - 1 )
      {
        outline->n_contours--;
        outline->n_points--;
      }
      else
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );
    }
  }